

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Interpolater.cpp
# Opt level: O1

void __thiscall
amrex::CellConservativeProtected::protect
          (CellConservativeProtected *this,FArrayBox *param_1,int param_2,FArrayBox *fine,
          int param_4,FArrayBox *fine_state,int param_6,int ncomp,Box *fine_region,IntVect *ratio,
          Geometry *crse_geom,Geometry *fine_geom,
          Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *param_12,RunOn runon)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  double *pdVar10;
  double *pdVar11;
  int iVar12;
  ulong uVar13;
  undefined8 uVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  double *pdVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  int k;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  double *pdVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  undefined4 in_register_00000084;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  int iVar48;
  int iVar49;
  long lVar50;
  long lVar51;
  int iVar52;
  int iVar53;
  long lVar54;
  double *pdVar55;
  long lVar56;
  int iVar57;
  long lVar58;
  int iVar59;
  bool bVar60;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  double dVar64;
  Real negVal;
  double dVar65;
  double dVar66;
  Real posVal;
  double dVar67;
  double dVar68;
  Box crse_bx;
  Box lhs;
  double *local_228;
  double *local_220;
  long local_190;
  long local_188;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  ulong local_58;
  int iStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  int local_44;
  undefined4 uStack_40;
  
  uVar61 = *(ulong *)(fine_region->smallend).vect;
  uVar13 = *(ulong *)(fine_region->bigend).vect;
  uVar14 = *(undefined8 *)((fine_region->bigend).vect + 2);
  iStack_50 = (int)*(undefined8 *)((fine_region->smallend).vect + 2);
  uVar63 = *(ulong *)(fine->super_BaseFab<double>).domain.smallend.vect;
  uVar62 = CONCAT44(-(uint)((int)(uVar63 >> 0x20) < (int)(uVar61 >> 0x20)),
                    -(uint)((int)uVar63 < (int)uVar61));
  local_58 = ~uVar62 & uVar63 | uVar61 & uVar62;
  iVar21 = (fine->super_BaseFab<double>).domain.smallend.vect[2];
  if (iVar21 < iStack_50) {
    iVar21 = iStack_50;
  }
  uVar63 = *(ulong *)(fine->super_BaseFab<double>).domain.bigend.vect;
  uVar61 = CONCAT44(-(uint)((int)(uVar13 >> 0x20) < (int)(uVar63 >> 0x20)),
                    -(uint)((int)uVar13 < (int)uVar63));
  uVar63 = ~uVar61 & uVar63 | uVar13 & uVar61;
  uStack_4c = (undefined4)uVar63;
  uStack_48 = (undefined4)(uVar63 >> 0x20);
  local_44 = (int)uVar14;
  iVar22 = (fine->super_BaseFab<double>).domain.bigend.vect[2];
  if (local_44 < iVar22) {
    iVar22 = local_44;
  }
  _local_44 = CONCAT44((int)((ulong)uVar14 >> 0x20),iVar22);
  iStack_50 = iVar21;
  (*(this->super_CellConservativeLinear).super_Interpolater.super_InterpBase._vptr_InterpBase[3])
            (&local_74,this,&local_58,ratio,CONCAT44(in_register_00000084,param_4));
  local_6c = local_6c + 1;
  if (local_6c < local_60) {
    pdVar10 = (fine->super_BaseFab<double>).dptr;
    iVar22 = (fine->super_BaseFab<double>).domain.smallend.vect[0];
    lVar44 = (long)iVar22;
    iVar1 = (fine->super_BaseFab<double>).domain.smallend.vect[2];
    lVar50 = (long)iVar1;
    iVar2 = (fine->super_BaseFab<double>).domain.bigend.vect[2];
    lVar47 = (long)((iVar2 - iVar1) + 1);
    pdVar11 = (fine_state->super_BaseFab<double>).dptr;
    iVar3 = (fine_state->super_BaseFab<double>).domain.smallend.vect[0];
    iVar21 = (fine_state->super_BaseFab<double>).domain.smallend.vect[2];
    lVar37 = lVar47 * 8 + lVar50 * -8;
    lVar33 = (long)(((fine_state->super_BaseFab<double>).domain.bigend.vect[2] - iVar21) + 1);
    lVar51 = lVar33 * 8 + (long)iVar21 * -8;
    local_70 = local_70 + 1;
    iVar4 = (fine->super_BaseFab<double>).domain.smallend.vect[1];
    lVar54 = (long)iVar4;
    iVar5 = (fine->super_BaseFab<double>).domain.bigend.vect[0];
    iVar6 = (fine->super_BaseFab<double>).domain.bigend.vect[1];
    lVar45 = (long)((iVar5 - iVar22) + 1);
    lVar23 = (long)((iVar6 - iVar4) + 1);
    lVar31 = lVar23 * lVar45;
    iVar40 = (fine_state->super_BaseFab<double>).domain.smallend.vect[1];
    lVar46 = (long)(((fine_state->super_BaseFab<double>).domain.bigend.vect[0] - iVar3) + 1);
    lVar24 = (long)(((fine_state->super_BaseFab<double>).domain.bigend.vect[1] - iVar40) + 1);
    iVar7 = ratio->vect[0];
    iVar8 = ratio->vect[1];
    iVar9 = ratio->vect[2];
    iVar21 = local_74 + 1;
    iVar52 = iVar9 * local_6c;
    lVar47 = lVar47 * lVar31;
    lVar58 = (long)iVar40 * -8;
    lVar25 = lVar24 * lVar46;
    lVar33 = lVar33 * lVar25;
    do {
      lVar16 = (long)iVar52;
      if (iVar52 < lVar50) {
        lVar16 = lVar50;
      }
      if (local_70 < local_64) {
        iVar40 = local_6c * iVar9;
        iVar53 = iVar1;
        if (iVar1 < iVar40) {
          iVar53 = iVar40;
        }
        iVar40 = iVar40 + iVar9 + -1;
        if (iVar2 < iVar40) {
          iVar40 = iVar2;
        }
        iVar28 = iVar8 * local_70;
        iVar15 = local_70;
        do {
          lVar17 = (long)iVar28;
          if (iVar28 < lVar54) {
            lVar17 = lVar54;
          }
          if (iVar21 < local_68) {
            iVar41 = iVar15 * iVar8;
            iVar48 = iVar4;
            if (iVar4 < iVar41) {
              iVar48 = iVar41;
            }
            iVar41 = iVar41 + iVar8 + -1;
            if (iVar6 < iVar41) {
              iVar41 = iVar6;
            }
            iVar59 = iVar41 + 1;
            lVar18 = (long)iVar48;
            lVar19 = lVar54 * -8 + lVar17 * 8;
            lVar34 = lVar17 * 8 + lVar58;
            iVar27 = iVar7 * iVar21;
            iVar12 = iVar21;
            iVar43 = (local_74 + 2) * iVar7 + -1;
            do {
              lVar29 = (long)iVar27;
              if (iVar27 < lVar44) {
                lVar29 = lVar44;
              }
              iVar26 = iVar43;
              if (iVar5 < iVar43) {
                iVar26 = iVar5;
              }
              iVar57 = iVar12 * iVar7;
              iVar49 = iVar22;
              if (iVar22 < iVar57) {
                iVar49 = iVar57;
              }
              iVar57 = iVar57 + iVar7 + -1;
              if (iVar5 < iVar57) {
                iVar57 = iVar5;
              }
              if (2 < ncomp) {
                iVar26 = (iVar26 - (int)lVar29) + 1;
                local_220 = pdVar10 + (lVar29 - lVar44);
                local_228 = pdVar11 + (lVar29 - iVar3);
                local_188 = (long)pdVar10 +
                            lVar29 * 8 +
                            ((lVar37 + lVar16 * 8) * lVar23 + lVar54 * -8 + lVar17 * 8) * lVar45 +
                            lVar44 * -8;
                local_190 = (long)pdVar11 +
                            lVar29 * 8 +
                            ((lVar51 + lVar16 * 8) * lVar24 + lVar58 + lVar17 * 8) * lVar46 +
                            (long)iVar3 * -8;
                dVar64 = (double)(((iVar57 - iVar49) + 1) *
                                 (iVar59 - iVar48) * ((iVar40 - iVar53) + 1));
                uVar63 = 1;
                do {
                  if (iVar53 <= iVar40) {
                    bVar60 = false;
                    lVar32 = local_190;
                    lVar36 = local_188;
                    iVar42 = iVar53;
                    do {
                      lVar35 = lVar18;
                      lVar30 = lVar32;
                      lVar56 = lVar36;
                      if (iVar48 <= iVar41) {
                        do {
                          if (iVar49 <= iVar57) {
                            lVar38 = 0;
                            do {
                              if (*(double *)(lVar30 + lVar38 * 8) +
                                  *(double *)(lVar56 + lVar38 * 8) < 0.0) {
                                bVar60 = true;
                              }
                              lVar38 = lVar38 + 1;
                            } while (iVar26 != (int)lVar38);
                          }
                          lVar35 = lVar35 + 1;
                          lVar56 = lVar56 + lVar45 * 8;
                          lVar30 = lVar30 + lVar46 * 8;
                        } while (iVar59 != (int)lVar35);
                      }
                      iVar42 = iVar42 + 1;
                      lVar36 = lVar36 + lVar31 * 8;
                      lVar32 = lVar32 + lVar25 * 8;
                    } while (iVar40 + 1 != iVar42);
                    if (bVar60) {
                      dVar66 = 0.0;
                      dVar67 = 0.0;
                      dVar65 = 0.0;
                      lVar32 = local_190;
                      lVar36 = local_188;
                      iVar42 = iVar53;
                      do {
                        lVar35 = lVar32;
                        lVar30 = lVar36;
                        lVar56 = lVar18;
                        if (iVar48 <= iVar41) {
                          do {
                            if (iVar49 <= iVar57) {
                              lVar38 = 0;
                              do {
                                dVar68 = *(double *)(lVar35 + lVar38 * 8);
                                if (dVar68 <= 0.0) {
                                  dVar67 = dVar67 + dVar68;
                                }
                                dVar65 = dVar65 + *(double *)(lVar30 + lVar38 * 8);
                                dVar66 = (double)(~-(ulong)(0.0 < dVar68) & (ulong)dVar66 |
                                                 (ulong)(dVar66 + dVar68) & -(ulong)(0.0 < dVar68));
                                lVar38 = lVar38 + 1;
                              } while (iVar26 != (int)lVar38);
                            }
                            lVar56 = lVar56 + 1;
                            lVar35 = lVar35 + lVar46 * 8;
                            lVar30 = lVar30 + lVar45 * 8;
                          } while (iVar59 != (int)lVar56);
                        }
                        iVar42 = iVar42 + 1;
                        lVar32 = lVar32 + lVar25 * 8;
                        lVar36 = lVar36 + lVar31 * 8;
                      } while (iVar40 + 1 != iVar42);
                      if (dVar65 <= 0.0) {
LAB_005b8794:
                        if (dVar65 < 0.0) {
                          if (ABS(dVar65) <= dVar66) {
                            if (ABS(dVar65) < dVar66) {
                              dVar68 = dVar67 + dVar66 + dVar65;
                              if (dVar68 <= 0.0) {
                                if (dVar68 < 0.0) {
                                  iVar42 = iVar53;
                                  do {
                                    if (iVar48 <= iVar41) {
                                      pdVar20 = (double *)
                                                (((lVar37 + (long)iVar42 * 8) * lVar23 + lVar19) *
                                                 lVar45 + (long)local_220);
                                      pdVar55 = (double *)
                                                ((((long)iVar42 * 8 + lVar51) * lVar24 + lVar34) *
                                                 lVar46 + (long)local_228);
                                      lVar32 = lVar18;
                                      do {
                                        if (iVar49 <= iVar57) {
                                          lVar36 = 0;
                                          do {
                                            dVar68 = pdVar55[lVar36];
                                            uVar61 = -(ulong)(-dVar68 < dVar68);
                                            pdVar20[lVar36] =
                                                 (double)(~uVar61 & (ulong)(((dVar65 + dVar66) /
                                                                            dVar67) * dVar68) |
                                                         (ulong)-dVar68 & uVar61);
                                            lVar36 = lVar36 + 1;
                                          } while (iVar26 != (int)lVar36);
                                        }
                                        lVar32 = lVar32 + 1;
                                        pdVar20 = pdVar20 + lVar45;
                                        pdVar55 = pdVar55 + lVar46;
                                      } while (iVar59 != (int)lVar32);
                                    }
                                    bVar60 = iVar42 != iVar40;
                                    iVar42 = iVar42 + 1;
                                  } while (bVar60);
                                }
                              }
                              else {
                                iVar42 = iVar53;
                                do {
                                  if (iVar48 <= iVar41) {
                                    pdVar20 = (double *)
                                              (((lVar37 + (long)iVar42 * 8) * lVar23 + lVar19) *
                                               lVar45 + (long)local_220);
                                    pdVar55 = (double *)
                                              ((((long)iVar42 * 8 + lVar51) * lVar24 + lVar34) *
                                               lVar46 + (long)local_228);
                                    lVar32 = lVar18;
                                    do {
                                      if (iVar49 <= iVar57) {
                                        lVar36 = 0;
                                        do {
                                          dVar68 = pdVar55[lVar36];
                                          uVar61 = -(ulong)(dVar68 < -dVar68);
                                          pdVar20[lVar36] =
                                               (double)(~uVar61 & (ulong)(((dVar65 + dVar67) /
                                                                          dVar66) * dVar68) |
                                                       (ulong)-dVar68 & uVar61);
                                          lVar36 = lVar36 + 1;
                                        } while (iVar26 != (int)lVar36);
                                      }
                                      lVar32 = lVar32 + 1;
                                      pdVar20 = pdVar20 + lVar45;
                                      pdVar55 = pdVar55 + lVar46;
                                    } while (iVar59 != (int)lVar32);
                                  }
                                  bVar60 = iVar42 != iVar40;
                                  iVar42 = iVar42 + 1;
                                } while (bVar60);
                              }
                            }
                          }
                          else {
                            iVar42 = iVar53;
                            do {
                              if (iVar48 <= iVar41) {
                                pdVar55 = (double *)
                                          (((lVar37 + (long)iVar42 * 8) * lVar23 + lVar19) * lVar45
                                          + (long)local_220);
                                pdVar20 = (double *)
                                          ((((long)iVar42 * 8 + lVar51) * lVar24 + lVar34) * lVar46
                                          + (long)local_228);
                                lVar32 = lVar18;
                                do {
                                  if (iVar49 <= iVar57) {
                                    lVar36 = 0;
                                    do {
                                      pdVar55[lVar36] =
                                           (dVar65 + dVar67 + dVar66) / dVar64 - pdVar20[lVar36];
                                      lVar36 = lVar36 + 1;
                                    } while (iVar26 != (int)lVar36);
                                  }
                                  lVar32 = lVar32 + 1;
                                  pdVar55 = pdVar55 + lVar45;
                                  pdVar20 = pdVar20 + lVar46;
                                } while (iVar59 != (int)lVar32);
                              }
                              bVar60 = iVar42 != iVar40;
                              iVar42 = iVar42 + 1;
                            } while (bVar60);
                          }
                        }
                      }
                      else {
                        dVar68 = ABS(dVar67);
                        if (dVar65 <= dVar68) {
                          if (dVar68 <= dVar65) goto LAB_005b8794;
                          iVar42 = iVar53;
                          do {
                            if (iVar48 <= iVar41) {
                              pdVar55 = (double *)
                                        (((lVar37 + (long)iVar42 * 8) * lVar23 + lVar19) * lVar45 +
                                        (long)local_220);
                              pdVar20 = (double *)
                                        ((((long)iVar42 * 8 + lVar51) * lVar24 + lVar34) * lVar46 +
                                        (long)local_228);
                              lVar32 = lVar18;
                              do {
                                if (iVar49 <= iVar57) {
                                  lVar36 = 0;
                                  do {
                                    pdVar55[lVar36] =
                                         (double)(-(ulong)(pdVar20[lVar36] < 0.0) &
                                                 (ulong)(ABS(pdVar20[lVar36]) * (dVar65 / dVar68)));
                                    lVar36 = lVar36 + 1;
                                  } while (iVar26 != (int)lVar36);
                                }
                                lVar32 = lVar32 + 1;
                                pdVar55 = pdVar55 + lVar45;
                                pdVar20 = pdVar20 + lVar46;
                              } while (iVar59 != (int)lVar32);
                            }
                            bVar60 = iVar42 != iVar40;
                            iVar42 = iVar42 + 1;
                          } while (bVar60);
                        }
                        else {
                          iVar42 = iVar53;
                          do {
                            if (iVar48 <= iVar41) {
                              pdVar20 = (double *)
                                        (((lVar37 + (long)iVar42 * 8) * lVar23 + lVar19) * lVar45 +
                                        (long)local_220);
                              pdVar55 = (double *)
                                        ((((long)iVar42 * 8 + lVar51) * lVar24 + lVar34) * lVar46 +
                                        (long)local_228);
                              lVar32 = lVar18;
                              do {
                                if (iVar49 <= iVar57) {
                                  lVar36 = 0;
                                  do {
                                    if (pdVar55[lVar36] < 0.0) {
                                      pdVar20[lVar36] = -pdVar55[lVar36];
                                    }
                                    if (dVar66 <= 0.0) {
                                      dVar67 = pdVar20[lVar36] + (dVar65 - dVar68) / dVar64;
LAB_005b86ac:
                                      pdVar20[lVar36] = dVar67;
                                    }
                                    else if (0.0 < pdVar55[lVar36]) {
                                      dVar67 = pdVar55[lVar36] * ((dVar65 - dVar68) / dVar66);
                                      goto LAB_005b86ac;
                                    }
                                    lVar36 = lVar36 + 1;
                                  } while (iVar26 != (int)lVar36);
                                }
                                lVar32 = lVar32 + 1;
                                pdVar20 = pdVar20 + lVar45;
                                pdVar55 = pdVar55 + lVar46;
                              } while (iVar59 != (int)lVar32);
                            }
                            bVar60 = iVar42 != iVar40;
                            iVar42 = iVar42 + 1;
                          } while (bVar60);
                        }
                      }
                    }
                  }
                  uVar63 = uVar63 + 1;
                  local_188 = local_188 + lVar47 * 8;
                  local_190 = local_190 + lVar33 * 8;
                  local_220 = local_220 + lVar47;
                  local_228 = local_228 + lVar33;
                } while (uVar63 != ncomp - 1);
              }
              if (iVar53 <= iVar40) {
                iVar26 = iVar53;
                do {
                  if (iVar48 <= iVar41) {
                    pdVar20 = (double *)
                              ((long)pdVar10 +
                              ((lVar37 + (long)iVar26 * 8) * lVar23 + lVar19) * lVar45 +
                              lVar29 * 8 + lVar44 * -8);
                    lVar36 = (iVar26 - iVar1) * lVar31;
                    lVar32 = lVar18;
                    do {
                      if (iVar49 <= iVar57) {
                        lVar30 = (lVar32 - lVar54) * lVar45;
                        lVar35 = (long)iVar49;
                        pdVar55 = pdVar20;
                        do {
                          pdVar10[lVar36 + lVar30 + (lVar35 - lVar44)] = 0.0;
                          if (2 < ncomp) {
                            dVar64 = 0.0;
                            lVar56 = (ulong)(ncomp - 1) - 1;
                            pdVar39 = pdVar55;
                            do {
                              dVar64 = dVar64 + *pdVar39;
                              pdVar10[lVar36 + lVar30 + (lVar35 - lVar44)] = dVar64;
                              pdVar39 = pdVar39 + lVar47;
                              lVar56 = lVar56 + -1;
                            } while (lVar56 != 0);
                          }
                          lVar35 = lVar35 + 1;
                          pdVar55 = pdVar55 + 1;
                        } while (iVar57 + 1 != (int)lVar35);
                      }
                      lVar32 = lVar32 + 1;
                      pdVar20 = pdVar20 + lVar45;
                    } while (iVar59 != (int)lVar32);
                  }
                  bVar60 = iVar26 != iVar40;
                  iVar26 = iVar26 + 1;
                } while (bVar60);
              }
              iVar43 = iVar43 + iVar7;
              iVar27 = iVar27 + iVar7;
              bVar60 = iVar12 != local_68 + -1;
              iVar12 = iVar12 + 1;
            } while (bVar60);
          }
          iVar28 = iVar28 + iVar8;
          bVar60 = iVar15 != local_64 + -1;
          iVar15 = iVar15 + 1;
        } while (bVar60);
      }
      iVar52 = iVar52 + iVar9;
      bVar60 = local_6c != local_60 + -1;
      local_6c = local_6c + 1;
    } while (bVar60);
  }
  return;
}

Assistant:

void
CellConservativeProtected::protect (const FArrayBox& /*crse*/,
                                    int              /*crse_comp*/,
                                    FArrayBox&       fine,
                                    int              /*fine_comp*/,
                                    FArrayBox&       fine_state,
                                    int              /*state_comp*/,
                                    int              ncomp,
                                    const Box&       fine_region,
                                    const IntVect&   ratio,
                                    const Geometry&  crse_geom,
                                    const Geometry&  fine_geom,
                                    Vector<BCRec>&   /*bcr*/,
                                    RunOn            runon)
{
#if (AMREX_SPACEDIM == 1)
    amrex::ignore_unused(fine,fine_state,
                         ncomp,fine_region,ratio,
                         crse_geom,fine_geom,runon);
    amrex::Abort("1D CellConservativeProtected::protect not supported");
#else
    BL_PROFILE("CellConservativeProtected::protect()");

    //
    // Make box which is intersection of fine_region and domain of fine.
    //
    Box target_fine_region = fine_region & fine.box();

    //
    // crse_bx is coarsening of target_fine_region, grown by 1.
    //
    Box crse_bx = CoarseBox(target_fine_region,ratio);

    //
    // cs_bx is coarsening of target_fine_region.
    //
    Box cs_bx(crse_bx);
    cs_bx.grow(-1);

#if (AMREX_SPACEDIM == 2)
    /*
     * Get coarse and fine geometry data.
     */
    GeometryData cs_geomdata = crse_geom.data();
    GeometryData fn_geomdata = fine_geom.data();
#else
    amrex::ignore_unused(crse_geom, fine_geom);
#endif

    // Extract box from fine fab
    const Box& fnbx = fine.box();

    // Extract pointers to fab data
    Array4<Real>       const&   fnarr = fine.array();
    Array4<Real const> const& fnstarr = fine_state.const_array();

    /*
     * Loop over coarse indices.
     */
#if (AMREX_SPACEDIM == 2)
    AMREX_HOST_DEVICE_PARALLEL_FOR_3D_FLAG(runon, cs_bx, ic, jc, kc,
    {
        ccprotect_2d(ic, jc, kc, ncomp,
                     fnbx, ratio,
                     cs_geomdata, fn_geomdata,
                     fnarr, fnstarr);
    }); // cs_bx
#else
    AMREX_HOST_DEVICE_PARALLEL_FOR_3D_FLAG(runon, cs_bx, ic, jc, kc,
    {
        ccprotect_3d(ic, jc, kc, ncomp,
                     fnbx, ratio,
                     fnarr, fnstarr);
    }); // cs_bx
#endif

#endif /*(AMREX_SPACEDIM == 1)*/

}